

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::logDeviceInfo(CLIntercept *this,cl_device_id device)

{
  cl_int cVar1;
  cl_int cVar2;
  cl_int cVar3;
  cl_int cVar4;
  cl_int cVar5;
  cl_int cVar6;
  char *pcVar7;
  char *pcVar8;
  float __x;
  float fVar9;
  float __x_00;
  double __x_01;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar10;
  undefined8 extraout_XMM0_Qa_00;
  allocator local_81;
  char *deviceExtensions;
  char *driverVersion;
  char *deviceVersion;
  char *deviceVendor;
  char *deviceName;
  char *nextExtension;
  cl_device_type deviceType;
  
  deviceName = (char *)0x0;
  deviceVendor = (char *)0x0;
  deviceVersion = (char *)0x0;
  driverVersion = (char *)0x0;
  deviceExtensions = (char *)0x0;
  cVar1 = (*(this->m_Dispatch).clGetDeviceInfo)(device,0x1000,8,&deviceType,(size_t *)0x0);
  cVar2 = allocateAndGetDeviceInfoString(this,device,0x102b,&deviceName);
  cVar3 = allocateAndGetDeviceInfoString(this,device,0x102c,&deviceVendor);
  cVar4 = allocateAndGetDeviceInfoString(this,device,0x102f,&deviceVersion);
  cVar5 = allocateAndGetDeviceInfoString(this,device,0x102d,&driverVersion);
  cVar6 = allocateAndGetDeviceInfoString(this,device,0x1030,&deviceExtensions);
  pcVar8 = deviceName;
  if (cVar6 == 0 && ((cVar5 == 0 && (cVar4 == 0 && (cVar3 == 0 && cVar2 == 0))) && cVar1 == 0)) {
    fVar9 = logf(this,__x);
    fVar9 = logf(this,fVar9);
    fVar9 = logf(this,fVar9);
    logf(this,fVar9);
    CEnumNameMap::name_device_type_abi_cxx11_
              ((string *)&nextExtension,&this->m_EnumNameMap,deviceType);
    logf(this,__x_00);
    fVar9 = (float)std::__cxx11::string::~string((string *)&nextExtension);
    fVar9 = logf(this,fVar9);
    if (deviceExtensions != (char *)0x0) {
      nextExtension = (char *)0x0;
      pcVar7 = strtok_r(deviceExtensions," ",&nextExtension);
      uVar10 = extraout_XMM0_Qa;
      while (fVar9 = (float)uVar10, pcVar7 != (char *)0x0) {
        logf(this,fVar9);
        pcVar7 = strtok_r((char *)0x0," ",&nextExtension);
        uVar10 = extraout_XMM0_Qa_00;
      }
    }
    logf(this,fVar9);
  }
  else {
    __x_01 = (double)std::__cxx11::string::string
                               ((string *)&nextExtension,"Error getting device info!\n",&local_81);
    log(this,__x_01);
    std::__cxx11::string::~string((string *)&nextExtension);
    pcVar8 = deviceName;
  }
  if (pcVar8 != (char *)0x0) {
    operator_delete__(pcVar8);
  }
  if (deviceVendor != (char *)0x0) {
    operator_delete__(deviceVendor);
  }
  if (deviceVersion != (char *)0x0) {
    operator_delete__(deviceVersion);
  }
  if (driverVersion != (char *)0x0) {
    operator_delete__(driverVersion);
  }
  if (deviceExtensions != (char *)0x0) {
    operator_delete__(deviceExtensions);
  }
  return;
}

Assistant:

void CLIntercept::logDeviceInfo( cl_device_id device )
{
    cl_int  errorCode = CL_SUCCESS;

    cl_device_type  deviceType;
    char*   deviceName = NULL;
    char*   deviceVendor = NULL;
    char*   deviceVersion = NULL;
    char*   driverVersion = NULL;
    char*   deviceExtensions = NULL;

    errorCode |= dispatch().clGetDeviceInfo(
        device,
        CL_DEVICE_TYPE,
        sizeof( deviceType ),
        &deviceType,
        NULL );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_NAME,
        deviceName );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_VENDOR,
        deviceVendor );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_VERSION,
        deviceVersion );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DRIVER_VERSION,
        driverVersion );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_EXTENSIONS,
        deviceExtensions );

    if( errorCode == CL_SUCCESS )
    {
        logf( "\tName:           %s\n", deviceName );
        logf( "\tVendor:         %s\n", deviceVendor );
        logf( "\tVersion:        %s\n", deviceVersion );
        logf( "\tDriver Version: %s\n", driverVersion );
        logf( "\tType:           %s\n", enumName().name_device_type( deviceType ).c_str() );

        int     numberOfExtensions = 0;
        logf( "\tExtensions:\n" );
        if( deviceExtensions )
        {
            char*   extension = NULL;
            char*   nextExtension = NULL;
            extension = CLI_STRTOK( deviceExtensions, " ", &nextExtension );
            while( extension != NULL )
            {
                numberOfExtensions++;
                logf( "\t\t%s\n", extension );
                extension = CLI_STRTOK( NULL, " ", &nextExtension );
            }
        }
        logf( "\t\t%d Device Extensions Found\n", numberOfExtensions );
    }
    else
    {
        log( "Error getting device info!\n" );
    }

    delete [] deviceName;
    delete [] deviceVendor;
    delete [] deviceVersion;
    delete [] driverVersion;
    delete [] deviceExtensions;
}